

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idn.c
# Opt level: O0

_Bool Curl_is_ASCII_name(char *hostname)

{
  byte bVar1;
  byte *local_20;
  uchar *ch;
  char *hostname_local;
  
  local_20 = (byte *)hostname;
  if (hostname == (char *)0x0) {
    hostname_local._7_1_ = true;
  }
  else {
    do {
      if (*local_20 == 0) {
        return true;
      }
      bVar1 = *local_20;
      local_20 = local_20 + 1;
    } while ((bVar1 & 0x80) == 0);
    hostname_local._7_1_ = false;
  }
  return hostname_local._7_1_;
}

Assistant:

bool Curl_is_ASCII_name(const char *hostname)
{
  /* get an UNSIGNED local version of the pointer */
  const unsigned char *ch = (const unsigned char *)hostname;

  if(!hostname) /* bad input, consider it ASCII! */
    return TRUE;

  while(*ch) {
    if(*ch++ & 0x80)
      return FALSE;
  }
  return TRUE;
}